

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cProgramInterfaceQueryTests.cpp
# Opt level: O2

long __thiscall gl4cts::anon_unknown_0::InvalidOperationTest::Run(InvalidOperationTest *this)

{
  CallLogWrapper *this_00;
  undefined8 src_vs;
  GLuint program;
  GLuint program_00;
  GLuint program_01;
  GLenum props [1];
  GLsizei len;
  GLint res;
  long error;
  GLchar name [100];
  
  error = 0;
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x16])(name,this);
  src_vs = name._0_8_;
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x17])(&res,this);
  program = PIQBase::CreateProgram((PIQBase *)this,(char *)src_vs,_res,false);
  std::__cxx11::string::~string((string *)&res);
  std::__cxx11::string::~string((string *)name);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x16])(name,this);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x17])(&res,this);
  program_00 = PIQBase::CreateProgram((PIQBase *)this,(char *)name._0_8_,_res,false);
  std::__cxx11::string::~string((string *)&res);
  std::__cxx11::string::~string((string *)name);
  this_00 = &(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  glu::CallLogWrapper::glBindAttribLocation(this_00,program,0,"position");
  glu::CallLogWrapper::glBindFragDataLocation(this_00,program,0,"color");
  PIQBase::LinkProgram((PIQBase *)this,program);
  program_01 = glu::CallLogWrapper::glCreateShader(this_00,0x8b30);
  name[0x50] = '\0';
  name[0x51] = '\0';
  name[0x52] = '\0';
  name[0x53] = '\0';
  name[0x54] = '\0';
  name[0x55] = '\0';
  name[0x56] = '\0';
  name[0x57] = '\0';
  name[0x58] = '\0';
  name[0x59] = '\0';
  name[0x5a] = '\0';
  name[0x5b] = '\0';
  name[0x5c] = '\0';
  name[0x5d] = '\0';
  name[0x5e] = '\0';
  name[0x5f] = '\0';
  name[0x40] = '\0';
  name[0x41] = '\0';
  name[0x42] = '\0';
  name[0x43] = '\0';
  name[0x44] = '\0';
  name[0x45] = '\0';
  name[0x46] = '\0';
  name[0x47] = '\0';
  name[0x48] = '\0';
  name[0x49] = '\0';
  name[0x4a] = '\0';
  name[0x4b] = '\0';
  name[0x4c] = '\0';
  name[0x4d] = '\0';
  name[0x4e] = '\0';
  name[0x4f] = '\0';
  name[0x30] = '\0';
  name[0x31] = '\0';
  name[0x32] = '\0';
  name[0x33] = '\0';
  name[0x34] = '\0';
  name[0x35] = '\0';
  name[0x36] = '\0';
  name[0x37] = '\0';
  name[0x38] = '\0';
  name[0x39] = '\0';
  name[0x3a] = '\0';
  name[0x3b] = '\0';
  name[0x3c] = '\0';
  name[0x3d] = '\0';
  name[0x3e] = '\0';
  name[0x3f] = '\0';
  name[0x20] = '\0';
  name[0x21] = '\0';
  name[0x22] = '\0';
  name[0x23] = '\0';
  name[0x24] = '\0';
  name[0x25] = '\0';
  name[0x26] = '\0';
  name[0x27] = '\0';
  name[0x28] = '\0';
  name[0x29] = '\0';
  name[0x2a] = '\0';
  name[0x2b] = '\0';
  name[0x2c] = '\0';
  name[0x2d] = '\0';
  name[0x2e] = '\0';
  name[0x2f] = '\0';
  name[0x60] = '\0';
  name[0x61] = '\0';
  name[0x62] = '\0';
  name[99] = '\0';
  name[0x10] = '\0';
  name[0x11] = '\0';
  name[0x12] = '\0';
  name[0x13] = '\0';
  name[0x14] = '\0';
  name[0x15] = '\0';
  name[0x16] = '\0';
  name[0x17] = '\0';
  name[0x18] = '\0';
  name[0x19] = '\0';
  name[0x1a] = '\0';
  name[0x1b] = '\0';
  name[0x1c] = '\0';
  name[0x1d] = '\0';
  name[0x1e] = '\0';
  name[0x1f] = '\0';
  name[0] = '\0';
  name[1] = '\0';
  name[2] = '\0';
  name[3] = '\0';
  name[4] = '\0';
  name[5] = '\0';
  name[6] = '\0';
  name[7] = '\0';
  name[8] = '\0';
  name[9] = '\0';
  name[10] = '\0';
  name[0xb] = '\0';
  name[0xc] = '\0';
  name[0xd] = '\0';
  name[0xe] = '\0';
  name[0xf] = '\0';
  props[0] = 0x92fc;
  anon_unknown_0::Output("Case 1: <program> is the name of a shader object\n");
  glu::CallLogWrapper::glGetProgramInterfaceiv(this_00,program_01,0x92e3,0x92f5,&res);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xc]
  )(this,0x502,&error);
  glu::CallLogWrapper::glGetProgramResourceIndex(this_00,program_01,0x92e3,"pie");
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xc]
  )(this,0x502,&error);
  glu::CallLogWrapper::glGetProgramResourceName(this_00,program_01,0x92e3,0,0x400,&len,name);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xc]
  )(this,0x502,&error);
  glu::CallLogWrapper::glGetProgramResourceiv(this_00,program_01,0x92e3,0,1,props,0x400,&len,&res);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xc]
  )(this,0x502,&error);
  glu::CallLogWrapper::glGetProgramResourceLocation(this_00,program_01,0x92e3,"pie");
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xc]
  )(this,0x502,&error);
  glu::CallLogWrapper::glGetProgramResourceLocationIndex(this_00,program_01,0x92e4,"pie");
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xc]
  )(this,0x502,&error);
  glu::CallLogWrapper::glDeleteShader(this_00,program_01);
  anon_unknown_0::Output("Case 1 finished\n");
  anon_unknown_0::Output("Case 2: <pname> is not supported in GetProgramInterfaceiv\n");
  glu::CallLogWrapper::glGetProgramInterfaceiv(this_00,program,0x92e3,0x92f7,&res);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xc]
  )(this,0x502,&error);
  anon_unknown_0::Output("Case 2 finished\n");
  anon_unknown_0::Output("Case 3: <props> is not supported in GetProgramResourceiv");
  glu::CallLogWrapper::glGetProgramResourceiv(this_00,program,0x92e3,0,1,props,0x400,&len,&res);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xc]
  )(this,0x502,&error);
  anon_unknown_0::Output("Case 3 finished\n");
  anon_unknown_0::Output
            (
            "Case 4: <program> has not been linked in GetProgramResourceLocation/GetProgramResourceLocationIndex\n"
            );
  glu::CallLogWrapper::glGetProgramResourceLocation(this_00,program_00,0x92e3,"pie");
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xc]
  )(this,0x502,&error);
  glu::CallLogWrapper::glGetProgramResourceLocationIndex(this_00,program_00,0x92e4,"pie");
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xc]
  )(this,0x502,&error);
  anon_unknown_0::Output("Case 4 finished\n");
  glu::CallLogWrapper::glDeleteProgram(this_00,program);
  glu::CallLogWrapper::glDeleteProgram(this_00,program_00);
  return error;
}

Assistant:

virtual long Run()
	{
		long error = NO_ERROR;

		GLuint program  = CreateProgram(VertexShader().c_str(), FragmentShader().c_str(), false);
		GLuint program2 = CreateProgram(VertexShader().c_str(), FragmentShader().c_str(), false);
		glBindAttribLocation(program, 0, "position");
		glBindFragDataLocation(program, 0, "color");
		LinkProgram(program);

		const GLuint sh = glCreateShader(GL_FRAGMENT_SHADER);
		GLint		 res;
		GLsizei		 len;
		GLchar		 name[100] = { '\0' };
		GLenum		 props[1]  = { GL_OFFSET };

		Output("Case 1: <program> is the name of a shader object\n");
		glGetProgramInterfaceiv(sh, GL_PROGRAM_INPUT, GL_ACTIVE_RESOURCES, &res);
		ExpectError(GL_INVALID_OPERATION, error);
		glGetProgramResourceIndex(sh, GL_PROGRAM_INPUT, "pie");
		ExpectError(GL_INVALID_OPERATION, error);
		glGetProgramResourceName(sh, GL_PROGRAM_INPUT, 0, 1024, &len, name);
		ExpectError(GL_INVALID_OPERATION, error);
		glGetProgramResourceiv(sh, GL_PROGRAM_INPUT, 0, 1, props, 1024, &len, &res);
		ExpectError(GL_INVALID_OPERATION, error);
		glGetProgramResourceLocation(sh, GL_PROGRAM_INPUT, "pie");
		ExpectError(GL_INVALID_OPERATION, error);
		glGetProgramResourceLocationIndex(sh, GL_PROGRAM_OUTPUT, "pie");
		ExpectError(GL_INVALID_OPERATION, error);
		glDeleteShader(sh);
		Output("Case 1 finished\n");

		Output("Case 2: <pname> is not supported in GetProgramInterfaceiv\n");
		glGetProgramInterfaceiv(program, GL_PROGRAM_INPUT, GL_MAX_NUM_ACTIVE_VARIABLES, &res);
		ExpectError(GL_INVALID_OPERATION, error);
		Output("Case 2 finished\n");

		Output("Case 3: <props> is not supported in GetProgramResourceiv");
		glGetProgramResourceiv(program, GL_PROGRAM_INPUT, 0, 1, props, 1024, &len, &res);
		ExpectError(GL_INVALID_OPERATION, error);
		Output("Case 3 finished\n");

		Output("Case 4: <program> has not been linked in GetProgramResourceLocation/GetProgramResourceLocationIndex\n");
		glGetProgramResourceLocation(program2, GL_PROGRAM_INPUT, "pie");
		ExpectError(GL_INVALID_OPERATION, error);
		glGetProgramResourceLocationIndex(program2, GL_PROGRAM_OUTPUT, "pie");
		ExpectError(GL_INVALID_OPERATION, error);
		Output("Case 4 finished\n");

		glDeleteProgram(program);
		glDeleteProgram(program2);
		return error;
	}